

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Track::Write(Track *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  int extraout_var_00;
  int extraout_var_01;
  uint64_t uVar7;
  int extraout_var_02;
  ContentEncoding *encoding_1;
  uint32_t i_1;
  ContentEncoding *encoding;
  uint64 uStack_48;
  uint32_t i;
  uint64_t content_encodings_size;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t size;
  uint64_t payload_size;
  IMkvWriter *writer_local;
  Track *this_local;
  
  if (writer == (IMkvWriter *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((this->type_ == 0) || (this->codec_id_ == (char *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = strcmp(this->codec_id_,"V_AV1");
    if ((iVar2 == 0) && (this->codec_private_ == (uint8_t *)0x0)) {
      this_local._7_1_ = false;
    }
    else {
      iVar2 = (*this->_vptr_Track[3])();
      bVar1 = WriteEbmlMasterElement(writer,0xae,CONCAT44(extraout_var,iVar2));
      if (bVar1) {
        uVar4 = EbmlElementSize(0xd7,this->number_);
        uVar5 = EbmlElementSize(0x73c5,this->uid_);
        uVar6 = EbmlElementSize(0x83,this->type_);
        payload_position = uVar6 + uVar5 + uVar4;
        if (this->codec_id_ != (char *)0x0) {
          uVar4 = EbmlElementSize(0x86,this->codec_id_);
          payload_position = uVar4 + payload_position;
        }
        if (this->codec_private_ != (uint8_t *)0x0) {
          uVar4 = EbmlElementSize(0x63a2,this->codec_private_,this->codec_private_length_);
          payload_position = uVar4 + payload_position;
        }
        if (this->language_ != (char *)0x0) {
          uVar4 = EbmlElementSize(0x22b59c,this->language_);
          payload_position = uVar4 + payload_position;
        }
        if (this->name_ != (char *)0x0) {
          uVar4 = EbmlElementSize(0x536e,this->name_);
          payload_position = uVar4 + payload_position;
        }
        if (this->max_block_additional_id_ != 0) {
          uVar4 = EbmlElementSize(0x55ee,this->max_block_additional_id_);
          payload_position = uVar4 + payload_position;
        }
        if (this->codec_delay_ != 0) {
          uVar4 = EbmlElementSize(0x56aa,this->codec_delay_);
          payload_position = uVar4 + payload_position;
        }
        if (this->seek_pre_roll_ != 0) {
          uVar4 = EbmlElementSize(0x56bb,this->seek_pre_roll_);
          payload_position = uVar4 + payload_position;
        }
        if (this->default_duration_ != 0) {
          uVar4 = EbmlElementSize(0x23e383,this->default_duration_);
          payload_position = uVar4 + payload_position;
        }
        iVar2 = (*writer->_vptr_IMkvWriter[1])();
        if (extraout_var_00 < 0) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = WriteEbmlElement(writer,0xd7,this->number_);
          if (bVar1) {
            bVar1 = WriteEbmlElement(writer,0x73c5,this->uid_);
            if (bVar1) {
              bVar1 = WriteEbmlElement(writer,0x83,this->type_);
              if (bVar1) {
                if ((this->max_block_additional_id_ == 0) ||
                   (bVar1 = WriteEbmlElement(writer,0x55ee,this->max_block_additional_id_), bVar1))
                {
                  if ((this->codec_delay_ == 0) ||
                     (bVar1 = WriteEbmlElement(writer,0x56aa,this->codec_delay_), bVar1)) {
                    if ((this->seek_pre_roll_ == 0) ||
                       (bVar1 = WriteEbmlElement(writer,0x56bb,this->seek_pre_roll_), bVar1)) {
                      if ((this->default_duration_ == 0) ||
                         (bVar1 = WriteEbmlElement(writer,0x23e383,this->default_duration_), bVar1))
                      {
                        if ((this->codec_id_ == (char *)0x0) ||
                           (bVar1 = WriteEbmlElement(writer,0x86,this->codec_id_), bVar1)) {
                          if ((this->codec_private_ == (uint8_t *)0x0) ||
                             (bVar1 = WriteEbmlElement(writer,0x63a2,this->codec_private_,
                                                       this->codec_private_length_), bVar1)) {
                            if ((this->language_ == (char *)0x0) ||
                               (bVar1 = WriteEbmlElement(writer,0x22b59c,this->language_), bVar1)) {
                              if ((this->name_ == (char *)0x0) ||
                                 (bVar1 = WriteEbmlElement(writer,0x536e,this->name_), bVar1)) {
                                iVar3 = (*writer->_vptr_IMkvWriter[1])();
                                if ((extraout_var_01 < 0) ||
                                   (CONCAT44(extraout_var_01,iVar3) -
                                    CONCAT44(extraout_var_00,iVar2) != payload_position)) {
                                  this_local._7_1_ = false;
                                }
                                else {
                                  if (this->content_encoding_entries_size_ != 0) {
                                    uStack_48 = 0;
                                    for (encoding._4_4_ = 0;
                                        encoding._4_4_ < this->content_encoding_entries_size_;
                                        encoding._4_4_ = encoding._4_4_ + 1) {
                                      uVar7 = ContentEncoding::Size
                                                        (this->content_encoding_entries_
                                                         [encoding._4_4_]);
                                      uStack_48 = uVar7 + uStack_48;
                                    }
                                    bVar1 = WriteEbmlMasterElement(writer,0x6d80,uStack_48);
                                    if (!bVar1) {
                                      return false;
                                    }
                                    for (encoding_1._4_4_ = 0;
                                        encoding_1._4_4_ < this->content_encoding_entries_size_;
                                        encoding_1._4_4_ = encoding_1._4_4_ + 1) {
                                      bVar1 = ContentEncoding::Write
                                                        (this->content_encoding_entries_
                                                         [encoding_1._4_4_],writer);
                                      if (!bVar1) {
                                        return false;
                                      }
                                    }
                                  }
                                  (*writer->_vptr_IMkvWriter[1])();
                                  if (extraout_var_02 < 0) {
                                    this_local._7_1_ = false;
                                  }
                                  else {
                                    this_local._7_1_ = true;
                                  }
                                }
                              }
                              else {
                                this_local._7_1_ = false;
                              }
                            }
                            else {
                              this_local._7_1_ = false;
                            }
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Track::Write(IMkvWriter* writer) const {
  if (!writer)
    return false;

  // mandatory elements without a default value.
  if (!type_ || !codec_id_)
    return false;

  // AV1 tracks require a CodecPrivate. See
  // https://github.com/ietf-wg-cellar/matroska-specification/blob/HEAD/codec/av1.md
  // TODO(tomfinegan): Update the above link to the AV1 Matroska mappings to
  // point to a stable version once it is finalized, or our own WebM mappings
  // page on webmproject.org should we decide to release them.
  if (!strcmp(codec_id_, Tracks::kAv1CodecId) && !codec_private_)
    return false;

  // |size| may be bigger than what is written out in this function because
  // derived classes may write out more data in the Track element.
  const uint64_t payload_size = PayloadSize();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTrackEntry, payload_size))
    return false;

  uint64_t size =
      EbmlElementSize(libwebm::kMkvTrackNumber, static_cast<uint64>(number_));
  size += EbmlElementSize(libwebm::kMkvTrackUID, static_cast<uint64>(uid_));
  size += EbmlElementSize(libwebm::kMkvTrackType, static_cast<uint64>(type_));
  if (codec_id_)
    size += EbmlElementSize(libwebm::kMkvCodecID, codec_id_);
  if (codec_private_)
    size += EbmlElementSize(libwebm::kMkvCodecPrivate, codec_private_,
                            static_cast<uint64>(codec_private_length_));
  if (language_)
    size += EbmlElementSize(libwebm::kMkvLanguage, language_);
  if (name_)
    size += EbmlElementSize(libwebm::kMkvName, name_);
  if (max_block_additional_id_)
    size += EbmlElementSize(libwebm::kMkvMaxBlockAdditionID,
                            static_cast<uint64>(max_block_additional_id_));
  if (codec_delay_)
    size += EbmlElementSize(libwebm::kMkvCodecDelay,
                            static_cast<uint64>(codec_delay_));
  if (seek_pre_roll_)
    size += EbmlElementSize(libwebm::kMkvSeekPreRoll,
                            static_cast<uint64>(seek_pre_roll_));
  if (default_duration_)
    size += EbmlElementSize(libwebm::kMkvDefaultDuration,
                            static_cast<uint64>(default_duration_));

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvTrackNumber,
                        static_cast<uint64>(number_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvTrackUID,
                        static_cast<uint64>(uid_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvTrackType,
                        static_cast<uint64>(type_)))
    return false;
  if (max_block_additional_id_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvMaxBlockAdditionID,
                          static_cast<uint64>(max_block_additional_id_))) {
      return false;
    }
  }
  if (codec_delay_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCodecDelay,
                          static_cast<uint64>(codec_delay_)))
      return false;
  }
  if (seek_pre_roll_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvSeekPreRoll,
                          static_cast<uint64>(seek_pre_roll_)))
      return false;
  }
  if (default_duration_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvDefaultDuration,
                          static_cast<uint64>(default_duration_)))
      return false;
  }
  if (codec_id_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCodecID, codec_id_))
      return false;
  }
  if (codec_private_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCodecPrivate, codec_private_,
                          static_cast<uint64>(codec_private_length_)))
      return false;
  }
  if (language_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvLanguage, language_))
      return false;
  }
  if (name_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvName, name_))
      return false;
  }

  int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  if (content_encoding_entries_size_ > 0) {
    uint64_t content_encodings_size = 0;
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      content_encodings_size += encoding->Size();
    }

    if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncodings,
                                content_encodings_size))
      return false;

    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      if (!encoding->Write(writer))
        return false;
    }
  }

  stop_position = writer->Position();
  if (stop_position < 0)
    return false;
  return true;
}